

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::ScriptHash::ScriptHash(ScriptHash *this,Script *script,bool is_witness)

{
  size_type sVar1;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  ByteData local_178;
  value_type local_159;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_150;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  value_type local_132 [2];
  undefined1 local_130 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  undefined1 local_e8 [8];
  ByteData160 hash160;
  value_type local_aa [2];
  undefined1 local_a8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  ByteData local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  undefined1 local_50 [8];
  ByteData256 hash256;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  bool is_witness_local;
  Script *script_local;
  ScriptHash *this_local;
  
  this->_vptr_ScriptHash = (_func_int **)&PTR__ScriptHash_0088cb08;
  ByteData::ByteData(&this->script_hash_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &hash256.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &hash256.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (is_witness) {
    Script::GetData(&local_80,script);
    ByteData::GetBytes(&local_68,&local_80);
    HashUtil::Sha256((ByteData256 *)local_50,&local_68);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
    ByteData::~ByteData(&local_80);
    ByteData256::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,
               (ByteData256 *)local_50);
    local_aa[1] = 0;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &hash256.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_aa + 1);
    sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
    local_aa[0] = (value_type)sVar1;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &hash256.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_aa);
    __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
    __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
    __result = ::std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &hash256.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    hash160.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)::std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )__first._M_current,
                             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )__last._M_current,__result);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
    ByteData256::~ByteData256((ByteData256 *)local_50);
  }
  else {
    Script::GetData((ByteData *)
                    &byte_array_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,script);
    ByteData::GetBytes(&local_100,
                       (ByteData *)
                       &byte_array_1.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    HashUtil::Hash160((ByteData160 *)local_e8,&local_100);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100);
    ByteData::~ByteData((ByteData *)
                        &byte_array_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    ByteData160::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,
               (ByteData160 *)local_e8);
    local_132[1] = 0xa9;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &hash256.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_132 + 1);
    sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    local_132[0] = (value_type)sVar1;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &hash256.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_132);
    local_140._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    local_148._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    local_150 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                ::std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &hash256.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_158 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                ::std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (local_140,local_148,
                           (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_150);
    local_159 = 0x87;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &hash256.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_159);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    ByteData160::~ByteData160((ByteData160 *)local_e8);
  }
  ByteData::ByteData(&local_178,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &hash256.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  ByteData::operator=(&this->script_hash_,&local_178);
  ByteData::~ByteData(&local_178);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &hash256.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

ScriptHash::ScriptHash(const Script& script, bool is_witness)
    : script_hash_() {
  std::vector<uint8_t> buffer;
  buffer.clear();

  // hash calculation
  if (is_witness) {
    ByteData256 hash256 = HashUtil::Sha256(script.GetData().GetBytes());
    const std::vector<uint8_t> byte_array = hash256.GetBytes();
    // scriptPubKey : 0 <32-byte-hash>(0x0020{32-byte-hash})
    buffer.push_back(kOp_0);
    buffer.push_back(static_cast<uint8_t>(byte_array.size()));
    std::copy(
        byte_array.begin(), byte_array.end(), std::back_inserter(buffer));

  } else {
    ByteData160 hash160 = HashUtil::Hash160(script.GetData().GetBytes());
    const std::vector<uint8_t> byte_array = hash160.GetBytes();
    // Pubkey script   : OP_HASH160 <Hash160(redeemScript)> OP_EQUAL
    buffer.push_back(kOpHash160);
    buffer.push_back(static_cast<uint8_t>(byte_array.size()));
    std::copy(
        byte_array.begin(), byte_array.end(), std::back_inserter(buffer));
    buffer.push_back(kOpEqual);
  }

  script_hash_ = ByteData(buffer);
}